

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O1

void __thiscall llvm::DWARFDebugFrame::parse(DWARFDebugFrame *this,DWARFDataExtractor Data)

{
  char cVar1;
  ArchType AVar2;
  CIE *pCVar3;
  DWARFDataExtractor Data_00;
  unkbyte9 Var4;
  bool bVar5;
  unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_> uVar6;
  byte bVar7;
  uint64_t uVar8;
  FDE *pFVar9;
  uint64_t uVar10;
  value_type *pvVar11;
  _Head_base<0UL,_llvm::dwarf::CIE_*,_false> _Var12;
  uint64_t PCRelOffset;
  ulong uVar13;
  uint32_t byte_size;
  _Head_base<0UL,_llvm::dwarf::CIE_*,_false> _Var14;
  int64_t iVar15;
  Error *E_00;
  __single_object _Var16;
  int iVar17;
  char *pcVar18;
  Optional<unsigned_long> OVar19;
  uint64_t local_140;
  uint64_t CodeAlignmentFactor;
  int64_t DataAlignmentFactor;
  uint64_t ReturnAddressRegister;
  _Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_> local_120;
  FDE *local_118;
  ulong local_110;
  _func_int **local_108;
  uint64_t local_100;
  void *local_f8;
  undefined8 uStack_f0;
  uint local_e8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_e0;
  char local_d8;
  uint64_t local_d0;
  vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
  *local_c8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_c0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_b8;
  undefined1 local_b0 [8];
  StringRef AugmentationString;
  uint64_t local_90;
  uint64_t Length;
  Error E;
  bool local_78;
  uint local_70;
  undefined1 local_6c [4];
  uint32_t FDEPointerEncoding;
  uint32_t LSDAPointerEncoding;
  __single_object Cie;
  ArchType local_58;
  char local_54;
  Optional<unsigned_int> PersonalityEncoding;
  uint64_t StartOffset;
  uint64_t Offset;
  uint8_t local_33;
  uint8_t local_32;
  byte local_31;
  uint8_t AddressSize;
  uint8_t SegmentDescriptorSize;
  uint8_t Version;
  
  StartOffset = 0;
  local_f8 = (void *)0x0;
  uStack_f0 = 0;
  local_e8 = 0;
  Offset = (uint64_t)this;
  if (Data.super_DataExtractor.Data.Length != 0) {
    local_c8 = (vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
                *)&this->Entries;
    local_108 = (_func_int **)&PTR__FrameEntry_01098478;
    do {
      PersonalityEncoding.Storage = (OptionalStorage<unsigned_int,_true>)StartOffset;
      uVar8 = DWARFDataExtractor::getRelocatedValue
                        (&Data,4,&StartOffset,(uint64_t *)0x0,(Error *)0x0);
      local_90 = uVar8;
      if (uVar8 == 0xffffffff) {
        local_90 = DWARFDataExtractor::getRelocatedValue
                             (&Data,8,&StartOffset,(uint64_t *)0x0,(Error *)0x0);
      }
      uVar10 = StartOffset;
      local_d0 = local_90 + StartOffset;
      byte_size = ((byte)~*(byte *)(Offset + 4) & 1) * 4 + 4;
      if (uVar8 != 0xffffffff) {
        byte_size = 4;
      }
      pFVar9 = (FDE *)DataExtractor::getUnsigned
                                (&Data.super_DataExtractor,&StartOffset,byte_size,(Error *)0x0);
      if (((pFVar9 == (FDE *)0xffffffff) ||
          (pFVar9 == (FDE *)0xffffffffffffffff && uVar8 == 0xffffffff)) ||
         (pFVar9 == (FDE *)0x0 && *(char *)(Offset + 4) == '\x01')) {
        local_31 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
        local_b0 = (undefined1  [8])DataExtractor::getCStr(&Data.super_DataExtractor,&StartOffset);
        if (local_b0 == (undefined1  [8])0x0) {
          local_b0 = (undefined1  [8])0xe85cd6;
        }
        AugmentationString.Data = (char *)strlen((char *)local_b0);
        if (3 < local_31) {
          Data.super_DataExtractor.AddressSize =
               DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
        }
        local_33 = Data.super_DataExtractor.AddressSize;
        if (local_31 < 4) {
          local_32 = '\0';
        }
        else {
          local_32 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
        }
        local_140 = DataExtractor::getULEB128(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
        CodeAlignmentFactor = DataExtractor::getSLEB128(&Data.super_DataExtractor,&StartOffset);
        _Var16 = Cie;
        if (local_31 == 1) {
          bVar7 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
          DataAlignmentFactor = (int64_t)bVar7;
        }
        else {
          DataAlignmentFactor =
               DataExtractor::getULEB128(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
        }
        Length = (long)"\n\r\t" + 3;
        E.Payload = (ErrorInfoBase *)0x0;
        local_70 = 0;
        local_6c = (undefined1  [4])0xff;
        local_e0.value = local_e0.value & 0xffffffffffffff00;
        local_d8 = '\0';
        local_58 = local_58 & 0xffffff00;
        local_54 = '\0';
        if (*(char *)(Offset + 4) == '\x01') {
          iVar17 = (int)AugmentationString.Data;
          if (iVar17 == 0) {
            bVar5 = false;
          }
          else {
            pcVar18 = (char *)0x0;
            bVar5 = false;
            do {
              if (AugmentationString.Data <= pcVar18) {
                __assert_fail("Index < Length && \"Invalid index!\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                              ,0xf9,"char llvm::StringRef::operator[](size_t) const");
              }
              cVar1 = *(char *)((long)local_b0 + (long)pcVar18);
              switch(cVar1) {
              case 'L':
                bVar7 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
                local_6c = (undefined1  [4])(uint)bVar7;
                break;
              case 'M':
              case 'N':
              case 'O':
              case 'Q':
switchD_00d789fe_caseD_4d:
                pcVar18 = "Unknown augmentation character in entry at %lx";
LAB_00d78f7e:
                ReportError((uint64_t)PersonalityEncoding.Storage,pcVar18);
              case 'P':
                if (local_d8 != '\0') {
                  pcVar18 = "Duplicate personality in entry at %lx";
                  goto LAB_00d78f7e;
                }
                bVar7 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
                local_58 = (ArchType)bVar7;
                if (local_54 == '\0') {
                  local_54 = '\x01';
                }
                if (local_54 == '\0') {
                  pcVar18 = 
                  "T &llvm::optional_detail::OptionalStorage<unsigned int>::getValue() & [T = unsigned int]"
                  ;
LAB_00d78f9c:
                  __assert_fail("hasVal",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                                ,0xad,pcVar18);
                }
                uVar8 = StartOffset + *(long *)(Offset + 8);
                if (*(long *)(Offset + 8) == 0) {
                  uVar8 = 0;
                }
                OVar19 = DWARFDataExtractor::getEncodedPointer(&Data,&StartOffset,bVar7,uVar8);
                local_e0 = OVar19.Storage.field_0;
                local_d8 = OVar19.Storage.hasVal;
                break;
              case 'R':
                bVar7 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
                local_70 = (uint)bVar7;
                break;
              case 'S':
                break;
              default:
                if (cVar1 != 'B') {
                  if (cVar1 != 'z') goto switchD_00d789fe_caseD_4d;
                  if ((int)pcVar18 != 0) {
                    pcVar18 = "\'z\' must be the first character at %lx";
                    goto LAB_00d78f7e;
                  }
                  Cie._M_t.
                  super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>
                  .super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl =
                       (__uniq_ptr_data<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>,_true,_true>
                        )DataExtractor::getULEB128
                                   (&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
                  if (!bVar5) {
                    bVar5 = true;
                  }
                  if (!bVar5) {
                    pcVar18 = 
                    "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                    ;
                    goto LAB_00d78f9c;
                  }
                  local_120.super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl =
                       (_Head_base<0UL,_llvm::dwarf::CIE_*,_false>)
                       (_Head_base<0UL,_llvm::dwarf::CIE_*,_false>)StartOffset;
                  Cie._M_t.
                  super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>
                  .super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl =
                       (__uniq_ptr_data<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>,_true,_true>
                        )((long)Cie._M_t.
                                super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>
                                .super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl +
                         StartOffset);
                }
              }
              pcVar18 = pcVar18 + 1;
            } while (iVar17 != (int)pcVar18);
          }
          _Var16._M_t.
          super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>._M_t.
          super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>.
          super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl =
               Cie._M_t.
               super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>._M_t.
               super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>.
               super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl;
          if (bVar5) {
            if ((__uniq_ptr_data<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>,_true,_true>
                 )StartOffset !=
                (__uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>)
                Cie._M_t.
                super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>._M_t
                .super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>.
                super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl) {
              ReportError((uint64_t)PersonalityEncoding.Storage,
                          "Parsing augmentation data at %lx failed");
            }
            _Var12 = local_120.super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl;
            if (Data.super_DataExtractor.Data.Length <
                (ulong)local_120.super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl) {
              _Var12._M_head_impl = (CIE *)Data.super_DataExtractor.Data.Length;
            }
            _Var14._M_head_impl =
                 (CIE *)Cie._M_t.
                        super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>
                        .super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl;
            if ((ulong)Cie._M_t.
                       super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>
                       .super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl <
                _Var12._M_head_impl) {
              _Var14._M_head_impl = _Var12._M_head_impl;
            }
            if (Data.super_DataExtractor.Data.Length <
                (ulong)Cie._M_t.
                       super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>
                       .super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl) {
              _Var14._M_head_impl = (CIE *)Data.super_DataExtractor.Data.Length;
            }
            E.Payload = (ErrorInfoBase *)((long)_Var14._M_head_impl - (long)_Var12._M_head_impl);
            Length = (uint64_t)
                     (Data.super_DataExtractor.Data.Data +
                     (long)&(_Var12._M_head_impl)->Augmentation + -0x58);
          }
        }
        Cie._M_t.super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>.
        _M_t.super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>.
        super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl =
             _Var16._M_t.
             super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>._M_t.
             super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>.
             super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl;
        std::
        make_unique<llvm::dwarf::CIE,unsigned_long&,unsigned_long&,unsigned_char&,llvm::StringRef&,unsigned_char&,unsigned_char&,unsigned_long&,long&,unsigned_long&,llvm::StringRef&,unsigned_int&,unsigned_int&,llvm::Optional<unsigned_long>&,llvm::Optional<unsigned_int>&,llvm::Triple::ArchType_const&>
                  ((unsigned_long *)&FDEPointerEncoding,(unsigned_long *)&PersonalityEncoding,
                   (uchar *)&local_90,(StringRef *)&local_31,local_b0,&local_33,
                   (unsigned_long *)&local_32,(long *)&local_140,&CodeAlignmentFactor,
                   (StringRef *)&DataAlignmentFactor,(uint *)&Length,&local_70,
                   (Optional<unsigned_long> *)local_6c,(Optional<unsigned_int> *)&local_e0,&local_58
                  );
        uVar6._M_t.super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>.
        _M_t.super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>.
        super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>,_true,_true>)
             (__uniq_ptr_data<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>,_true,_true>)
             _FDEPointerEncoding;
        pvVar11 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                  ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                                      *)&local_f8,(unsigned_long *)&PersonalityEncoding);
        (pvVar11->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).second =
             (CIE *)uVar6._M_t.
                    super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>
                    .super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
        ::emplace_back<std::unique_ptr<llvm::dwarf::CIE,std::default_delete<llvm::dwarf::CIE>>>
                  (local_c8,(unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_> *)
                            &FDEPointerEncoding);
        if ((_Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>)
            _FDEPointerEncoding != (CIE *)0x0) {
          (**(code **)(*(long *)_FDEPointerEncoding + 8))();
        }
      }
      else {
        local_b0 = (undefined1  [8])(uVar10 - (long)pFVar9);
        if (*(char *)(Offset + 4) == '\0') {
          local_b0 = (undefined1  [8])pFVar9;
        }
        local_118 = pFVar9;
        pvVar11 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                  ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                                      *)&local_f8,(unsigned_long *)local_b0);
        pCVar3 = (pvVar11->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).second;
        if (*(char *)(Offset + 4) == '\x01') {
          if (pCVar3 == (CIE *)0x0) {
            ReportError((uint64_t)PersonalityEncoding.Storage,
                        "Parsing FDE data at %lx failed due to missing CIE");
          }
          uVar8 = StartOffset + *(long *)(Offset + 8);
          if (*(long *)(Offset + 8) == 0) {
            uVar8 = 0;
          }
          OVar19 = DWARFDataExtractor::getEncodedPointer
                             (&Data,&StartOffset,(uint8_t)pCVar3->FDEPointerEncoding,uVar8);
          local_c0 = OVar19.Storage.field_0;
          if (((undefined1  [16])OVar19.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            local_c0.value = 0;
          }
          OVar19 = DWARFDataExtractor::getEncodedPointer
                             (&Data,&StartOffset,(uint8_t)pCVar3->FDEPointerEncoding,0);
          local_b8.value = OVar19.Storage.field_0.value;
          if (((undefined1  [16])OVar19.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            local_b8.value = 0;
          }
          if ((pCVar3->Augmentation).super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size == 0) goto LAB_00d78d53;
          uVar10 = DataExtractor::getULEB128(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
          uVar8 = StartOffset;
          if (pCVar3->LSDAPointerEncoding == 0xff) {
            Var4 = SUB169(ZEXT816(0),0);
          }
          else {
            PCRelOffset = *(long *)(Offset + 8) + StartOffset;
            if (*(long *)(Offset + 8) == 0) {
              PCRelOffset = 0;
            }
            local_100 = uVar10;
            OVar19 = DWARFDataExtractor::getEncodedPointer
                               (&Data,&StartOffset,(uint8_t)pCVar3->LSDAPointerEncoding,PCRelOffset)
            ;
            Var4 = OVar19.Storage._0_9_;
            local_110 = OVar19.Storage.field_0.value >> 8;
            uVar10 = local_100;
          }
          local_78 = SUB91((unkuint9)Var4 >> 0x40,0);
          bVar7 = (byte)Var4;
          if (StartOffset != uVar8 + uVar10) {
            ReportError((uint64_t)PersonalityEncoding.Storage,
                        "Parsing augmentation data at %lx failed");
          }
        }
        else {
          local_c0.value =
               DWARFDataExtractor::getRelocatedValue
                         (&Data,(uint)Data.super_DataExtractor.AddressSize,&StartOffset,
                          (uint64_t *)0x0,(Error *)0x0);
          local_b8.value =
               DWARFDataExtractor::getRelocatedValue
                         (&Data,(uint)Data.super_DataExtractor.AddressSize,&StartOffset,
                          (uint64_t *)0x0,(Error *)0x0);
LAB_00d78d53:
          local_78 = false;
          bVar7 = 0;
        }
        local_b0 = (undefined1  [8])operator_new(0x80);
        if (pCVar3 == (CIE *)0x0) {
          uVar8 = 0;
          iVar15 = 0;
        }
        else {
          uVar8 = pCVar3->CodeAlignmentFactor;
          iVar15 = pCVar3->DataAlignmentFactor;
        }
        AVar2 = *(ArchType *)Offset;
        (((FDE *)local_b0)->super_FrameEntry).Kind = FK_FDE;
        (((FDE *)local_b0)->super_FrameEntry).Offset = (uint64_t)PersonalityEncoding.Storage;
        (((FDE *)local_b0)->super_FrameEntry).Length = local_90;
        (((FDE *)local_b0)->super_FrameEntry).CFIs.Instructions.
        super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (((FDE *)local_b0)->super_FrameEntry).CFIs.Instructions.
        super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (((FDE *)local_b0)->super_FrameEntry).CFIs.Instructions.
        super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (((FDE *)local_b0)->super_FrameEntry).CFIs.CodeAlignmentFactor = uVar8;
        (((FDE *)local_b0)->super_FrameEntry).CFIs.DataAlignmentFactor = iVar15;
        (((FDE *)local_b0)->super_FrameEntry).CFIs.Arch = AVar2;
        (((FDE *)local_b0)->super_FrameEntry)._vptr_FrameEntry = local_108;
        ((FDE *)local_b0)->LinkedCIEOffset = (uint64_t)local_118;
        ((FDE *)local_b0)->InitialLocation = (uint64_t)local_c0;
        ((FDE *)local_b0)->AddressRange = (uint64_t)local_b8;
        ((FDE *)local_b0)->LinkedCIE = pCVar3;
        (((FDE *)local_b0)->LSDAAddress).Storage.field_0.value = (ulong)bVar7 | local_110 << 8;
        (((FDE *)local_b0)->LSDAAddress).Storage.hasVal = local_78;
        std::
        vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
        ::emplace_back<llvm::dwarf::FDE*>(local_c8,(FDE **)local_b0);
      }
      Data_00.super_DataExtractor.AddressSize = Data.super_DataExtractor.AddressSize;
      Data_00.super_DataExtractor.IsLittleEndian = Data.super_DataExtractor.IsLittleEndian;
      Data_00.super_DataExtractor._18_6_ = Data.super_DataExtractor._18_6_;
      Data_00.super_DataExtractor.Data.Length = Data.super_DataExtractor.Data.Length;
      Data_00.super_DataExtractor.Data.Data = Data.super_DataExtractor.Data.Data;
      Data_00.Obj = Data.Obj;
      Data_00.Section = Data.Section;
      dwarf::CFIProgram::parse
                ((CFIProgram *)&Length,Data_00,
                 (uint64_t *)(*(long *)(*(long *)(Offset + 0x18) + -8) + 0x20),
                 (uint64_t)&StartOffset);
      E_00 = (Error *)(Length & 0xfffffffffffffffe);
      uVar13 = (ulong)(E_00 != (Error *)0x0) | (ulong)E_00;
      if (E_00 != (Error *)0x0) {
        ReturnAddressRegister = Length | 1;
        Length = 0;
        toString_abi_cxx11_((string *)local_b0,(llvm *)&ReturnAddressRegister,E_00);
        report_fatal_error((string *)local_b0,true);
      }
      Length = uVar13;
      if (StartOffset != local_d0) {
        ReportError((uint64_t)PersonalityEncoding.Storage,"Parsing entry instructions at %lx failed"
                   );
      }
    } while (StartOffset < Data.super_DataExtractor.Data.Length);
  }
  operator_delete(local_f8,(ulong)local_e8 << 4,8);
  return;
}

Assistant:

void DWARFDebugFrame::parse(DWARFDataExtractor Data) {
  uint64_t Offset = 0;
  DenseMap<uint64_t, CIE *> CIEs;

  while (Data.isValidOffset(Offset)) {
    uint64_t StartOffset = Offset;

    bool IsDWARF64 = false;
    uint64_t Length = Data.getRelocatedValue(4, &Offset);
    uint64_t Id;

    if (Length == dwarf::DW_LENGTH_DWARF64) {
      // DWARF-64 is distinguished by the first 32 bits of the initial length
      // field being 0xffffffff. Then, the next 64 bits are the actual entry
      // length.
      IsDWARF64 = true;
      Length = Data.getRelocatedValue(8, &Offset);
    }

    // At this point, Offset points to the next field after Length.
    // Length is the structure size excluding itself. Compute an offset one
    // past the end of the structure (needed to know how many instructions to
    // read).
    uint64_t StartStructureOffset = Offset;
    uint64_t EndStructureOffset = Offset + Length;

    // The Id field's size depends on the DWARF format
    Id = Data.getUnsigned(&Offset, (IsDWARF64 && !IsEH) ? 8 : 4);
    bool IsCIE =
        ((IsDWARF64 && Id == DW64_CIE_ID) || Id == DW_CIE_ID || (IsEH && !Id));

    if (IsCIE) {
      uint8_t Version = Data.getU8(&Offset);
      const char *Augmentation = Data.getCStr(&Offset);
      StringRef AugmentationString(Augmentation ? Augmentation : "");
      uint8_t AddressSize = Version < 4 ? Data.getAddressSize() :
                                          Data.getU8(&Offset);
      Data.setAddressSize(AddressSize);
      uint8_t SegmentDescriptorSize = Version < 4 ? 0 : Data.getU8(&Offset);
      uint64_t CodeAlignmentFactor = Data.getULEB128(&Offset);
      int64_t DataAlignmentFactor = Data.getSLEB128(&Offset);
      uint64_t ReturnAddressRegister =
          Version == 1 ? Data.getU8(&Offset) : Data.getULEB128(&Offset);

      // Parse the augmentation data for EH CIEs
      StringRef AugmentationData("");
      uint32_t FDEPointerEncoding = DW_EH_PE_absptr;
      uint32_t LSDAPointerEncoding = DW_EH_PE_omit;
      Optional<uint64_t> Personality;
      Optional<uint32_t> PersonalityEncoding;
      if (IsEH) {
        Optional<uint64_t> AugmentationLength;
        uint64_t StartAugmentationOffset;
        uint64_t EndAugmentationOffset;

        // Walk the augmentation string to get all the augmentation data.
        for (unsigned i = 0, e = AugmentationString.size(); i != e; ++i) {
          switch (AugmentationString[i]) {
            default:
              ReportError(
                  StartOffset,
                  "Unknown augmentation character in entry at %" PRIx64);
            case 'L':
              LSDAPointerEncoding = Data.getU8(&Offset);
              break;
            case 'P': {
              if (Personality)
                ReportError(StartOffset,
                            "Duplicate personality in entry at %" PRIx64);
              PersonalityEncoding = Data.getU8(&Offset);
              Personality = Data.getEncodedPointer(
                  &Offset, *PersonalityEncoding,
                  EHFrameAddress ? EHFrameAddress + Offset : 0);
              break;
            }
            case 'R':
              FDEPointerEncoding = Data.getU8(&Offset);
              break;
            case 'S':
              // Current frame is a signal trampoline.
              break;
            case 'z':
              if (i)
                ReportError(StartOffset,
                            "'z' must be the first character at %" PRIx64);
              // Parse the augmentation length first.  We only parse it if
              // the string contains a 'z'.
              AugmentationLength = Data.getULEB128(&Offset);
              StartAugmentationOffset = Offset;
              EndAugmentationOffset = Offset + *AugmentationLength;
              break;
            case 'B':
              // B-Key is used for signing functions associated with this
              // augmentation string
              break;
          }
        }

        if (AugmentationLength.hasValue()) {
          if (Offset != EndAugmentationOffset)
            ReportError(StartOffset,
                        "Parsing augmentation data at %" PRIx64 " failed");

          AugmentationData = Data.getData().slice(StartAugmentationOffset,
                                                  EndAugmentationOffset);
        }
      }

      auto Cie = std::make_unique<CIE>(
          StartOffset, Length, Version, AugmentationString, AddressSize,
          SegmentDescriptorSize, CodeAlignmentFactor, DataAlignmentFactor,
          ReturnAddressRegister, AugmentationData, FDEPointerEncoding,
          LSDAPointerEncoding, Personality, PersonalityEncoding, Arch);
      CIEs[StartOffset] = Cie.get();
      Entries.emplace_back(std::move(Cie));
    } else {
      // FDE
      uint64_t CIEPointer = Id;
      uint64_t InitialLocation = 0;
      uint64_t AddressRange = 0;
      Optional<uint64_t> LSDAAddress;
      CIE *Cie = CIEs[IsEH ? (StartStructureOffset - CIEPointer) : CIEPointer];

      if (IsEH) {
        // The address size is encoded in the CIE we reference.
        if (!Cie)
          ReportError(StartOffset, "Parsing FDE data at %" PRIx64
                                   " failed due to missing CIE");

        if (auto Val = Data.getEncodedPointer(
                &Offset, Cie->getFDEPointerEncoding(),
                EHFrameAddress ? EHFrameAddress + Offset : 0)) {
          InitialLocation = *Val;
        }
        if (auto Val = Data.getEncodedPointer(
                &Offset, Cie->getFDEPointerEncoding(), 0)) {
          AddressRange = *Val;
        }

        StringRef AugmentationString = Cie->getAugmentationString();
        if (!AugmentationString.empty()) {
          // Parse the augmentation length and data for this FDE.
          uint64_t AugmentationLength = Data.getULEB128(&Offset);

          uint64_t EndAugmentationOffset = Offset + AugmentationLength;

          // Decode the LSDA if the CIE augmentation string said we should.
          if (Cie->getLSDAPointerEncoding() != DW_EH_PE_omit) {
            LSDAAddress = Data.getEncodedPointer(
                &Offset, Cie->getLSDAPointerEncoding(),
                EHFrameAddress ? Offset + EHFrameAddress : 0);
          }

          if (Offset != EndAugmentationOffset)
            ReportError(StartOffset,
                        "Parsing augmentation data at %" PRIx64 " failed");
        }
      } else {
        InitialLocation = Data.getRelocatedAddress(&Offset);
        AddressRange = Data.getRelocatedAddress(&Offset);
      }

      Entries.emplace_back(new FDE(StartOffset, Length, CIEPointer,
                                   InitialLocation, AddressRange,
                                   Cie, LSDAAddress, Arch));
    }

    if (Error E =
            Entries.back()->cfis().parse(Data, &Offset, EndStructureOffset)) {
      report_fatal_error(toString(std::move(E)));
    }

    if (Offset != EndStructureOffset)
      ReportError(StartOffset,
                  "Parsing entry instructions at %" PRIx64 " failed");
  }
}